

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

int __thiscall
Layer_c_api::forward_inplace
          (Layer_c_api *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  long lVar1;
  code *pcVar2;
  int iVar3;
  size_type sVar4;
  vector<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_> *this_00;
  reference pp_Var5;
  __ncnn_mat_t **pp_Var6;
  undefined8 in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  size_type in_RDI;
  int i;
  vector<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_> bottom_top_blobs0;
  int n;
  reference in_stack_ffffffffffffff90;
  int local_50;
  vector<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_> local_38;
  int local_1c;
  undefined8 local_18;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RSI);
  local_1c = (int)sVar4;
  this_00 = (vector<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_> *)(long)local_1c;
  std::allocator<__ncnn_mat_t_*>::allocator((allocator<__ncnn_mat_t_*> *)0x149ced);
  std::vector<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>::vector
            (this_00,in_RDI,(allocator_type *)in_stack_ffffffffffffff90);
  std::allocator<__ncnn_mat_t_*>::~allocator((allocator<__ncnn_mat_t_*> *)0x149d0d);
  for (local_50 = 0; local_50 < local_1c; local_50 = local_50 + 1) {
    in_stack_ffffffffffffff90 =
         std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_10,(long)local_50);
    pp_Var5 = std::vector<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>::operator[]
                        (&local_38,(long)local_50);
    *pp_Var5 = (value_type)in_stack_ffffffffffffff90;
  }
  lVar1 = *(long *)(in_RDI + 0xd0);
  pcVar2 = *(code **)(lVar1 + 0x40);
  pp_Var6 = std::vector<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>::data
                      ((vector<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_> *)0x149d94);
  iVar3 = (*pcVar2)(lVar1,pp_Var6,local_1c,local_18);
  std::vector<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_>::~vector
            ((vector<__ncnn_mat_t_*,_std::allocator<__ncnn_mat_t_*>_> *)in_stack_ffffffffffffff90);
  return iVar3;
}

Assistant:

virtual int forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
    {
        const int n = bottom_top_blobs.size();
        std::vector<ncnn_mat_t> bottom_top_blobs0(n);
        for (int i = 0; i < n; i++)
        {
            bottom_top_blobs0[i] = (ncnn_mat_t)&bottom_top_blobs[i];
        }
        return layer->forward_inplace_n(layer, bottom_top_blobs0.data(), n, (ncnn_option_t)&opt);
    }